

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

LBBox3fa * __thiscall embree::SceneGraph::GroupNode::lbounds(GroupNode *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  Vec3fa *pVVar6;
  BBox<embree::Vec3fa> *pBVar7;
  long in_RSI;
  LBBox3fa *in_RDI;
  float fVar8;
  Ref<embree::SceneGraph::Node> *c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *__range2;
  LBBox3fa *b;
  LBBox3fa *this_00;
  LBBox3fa *__lhs;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  reference local_308;
  Ref<embree::SceneGraph::Node> *local_300;
  __normal_iterator<const_embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_2f8;
  long local_2f0;
  reference local_2d0;
  BBox<embree::Vec3fa> *local_2b8;
  BBox<embree::Vec3fa> *local_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_294;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_274;
  Vec3fa *local_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  Vec3fa *pVStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_22c;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined8 *local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d8;
  BBox<embree::Vec3fa> *local_1d0;
  undefined8 *local_1c8;
  Vec3fa *local_1c0;
  undefined8 *local_1b8;
  BBox<embree::Vec3fa> *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 *local_180;
  undefined8 *local_170;
  Vec3fa *local_168;
  undefined8 *local_160;
  undefined8 *local_150;
  undefined8 *local_140;
  undefined1 local_138 [16];
  undefined8 *local_128;
  undefined8 *local_120;
  BBox<embree::Vec3fa> *local_118;
  undefined8 *local_110;
  undefined1 local_108 [16];
  undefined8 *local_f8;
  undefined8 *local_f0;
  Vec3fa *local_e8;
  undefined8 *local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  undefined8 *local_a8;
  undefined8 *local_a0;
  Vec3fa *local_98;
  undefined8 *local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined8 *local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_228 = &pos_inf;
  this_00 = in_RDI;
  __lhs = in_RDI;
  local_288 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->bounds0).lower.field_0 = CONCAT44(local_288,local_288);
  *(ulong *)((long)&(in_RDI->bounds0).lower.field_0 + 8) = CONCAT44(local_288,local_288);
  pVVar6 = &(in_RDI->bounds0).upper;
  local_218 = &neg_inf;
  fStack_284 = local_288;
  fStack_280 = local_288;
  fStack_27c = local_288;
  local_274 = local_288;
  pVStack_250 = pVVar6;
  fVar8 = std::numeric_limits<float>::infinity();
  local_248 = -fVar8;
  *(ulong *)&pVVar6->field_0 = CONCAT44(fVar8,fVar8) ^ 0x8000000080000000;
  *(ulong *)((long)&(in_RDI->bounds0).upper.field_0 + 8) =
       CONCAT44(fVar8,fVar8) ^ 0x8000000080000000;
  pBVar7 = &in_RDI->bounds1;
  local_220 = &pos_inf;
  local_2b8 = pBVar7;
  local_2b0 = pBVar7;
  fStack_244 = local_248;
  fStack_240 = local_248;
  fStack_23c = local_248;
  local_22c = local_248;
  local_2a8 = std::numeric_limits<float>::infinity();
  *(ulong *)&(pBVar7->lower).field_0 = CONCAT44(local_2a8,local_2a8);
  *(ulong *)((long)&(in_RDI->bounds1).lower.field_0 + 8) = CONCAT44(local_2a8,local_2a8);
  pVVar6 = &(in_RDI->bounds1).upper;
  local_210 = &neg_inf;
  fStack_2a4 = local_2a8;
  fStack_2a0 = local_2a8;
  fStack_29c = local_2a8;
  local_294 = local_2a8;
  local_270 = pVVar6;
  fVar8 = std::numeric_limits<float>::infinity();
  local_268 = -fVar8;
  *(ulong *)&pVVar6->field_0 = CONCAT44(fVar8,fVar8) ^ 0x8000000080000000;
  *(ulong *)((long)&(in_RDI->bounds1).upper.field_0 + 8) =
       CONCAT44(fVar8,fVar8) ^ 0x8000000080000000;
  local_2f0 = in_RSI + 0x68;
  fStack_264 = local_268;
  fStack_260 = local_268;
  fStack_25c = local_268;
  local_258 = local_268;
  local_2f8._M_current =
       (Ref<embree::SceneGraph::Node> *)
       std::
       vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
       ::begin((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                *)this_00);
  local_300 = (Ref<embree::SceneGraph::Node> *)
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
              ::end((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                     *)this_00);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                        *)__lhs,(__normal_iterator<const_embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)this_00);
    if (!bVar5) break;
    local_308 = __gnu_cxx::
                __normal_iterator<const_embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                ::operator*(&local_2f8);
    local_2d0 = local_308;
    (*(local_308->ptr->super_RefCount)._vptr_RefCount[0xc])(&local_348);
    local_208 = &local_348;
    local_140 = &local_198;
    local_18 = *(undefined8 *)&(this_00->bounds0).lower.field_0;
    uStack_10 = *(undefined8 *)((long)&(this_00->bounds0).lower.field_0 + 8);
    auVar1._8_8_ = uStack_340;
    auVar1._0_8_ = local_348;
    local_138 = minps((undefined1  [16])(this_00->bounds0).lower.field_0,auVar1);
    local_128 = &local_198;
    local_198 = local_138._0_8_;
    uStack_190 = local_138._8_8_;
    local_160 = &local_198;
    *(undefined8 *)&(this_00->bounds0).lower.field_0 = local_138._0_8_;
    *(undefined8 *)((long)&(this_00->bounds0).lower.field_0 + 8) = local_138._8_8_;
    local_e8 = &(this_00->bounds0).upper;
    local_f0 = &local_338;
    local_e0 = &local_1a8;
    local_c8 = *(undefined8 *)&local_e8->field_0;
    uStack_c0 = *(undefined8 *)((long)&(this_00->bounds0).upper.field_0 + 8);
    auVar2._8_8_ = uStack_330;
    auVar2._0_8_ = local_338;
    local_b8 = maxps((undefined1  [16])local_e8->field_0,auVar2);
    local_a8 = &local_1a8;
    local_1a8 = local_b8._0_8_;
    uStack_1a0 = local_b8._8_8_;
    local_168 = &(this_00->bounds0).upper;
    local_170 = &local_1a8;
    *(undefined8 *)&local_168->field_0 = local_b8._0_8_;
    *(undefined8 *)((long)&(this_00->bounds0).upper.field_0 + 8) = local_b8._8_8_;
    local_1d0 = &this_00->bounds1;
    local_1d8 = &local_328;
    local_110 = &local_1e8;
    local_38 = *(undefined8 *)&(local_1d0->lower).field_0;
    uStack_30 = *(undefined8 *)((long)&(this_00->bounds1).lower.field_0 + 8);
    auVar3._8_8_ = uStack_320;
    auVar3._0_8_ = local_328;
    local_108 = minps((undefined1  [16])(local_1d0->lower).field_0,auVar3);
    local_f8 = &local_1e8;
    local_1e8 = local_108._0_8_;
    uStack_1e0 = local_108._8_8_;
    local_1b8 = &local_1e8;
    *(undefined8 *)&(local_1d0->lower).field_0 = local_108._0_8_;
    *(undefined8 *)((long)&(this_00->bounds1).lower.field_0 + 8) = local_108._8_8_;
    local_98 = &(this_00->bounds1).upper;
    local_a0 = &local_318;
    local_90 = &local_1f8;
    local_78 = *(undefined8 *)&local_98->field_0;
    uStack_70 = *(undefined8 *)((long)&(this_00->bounds1).upper.field_0 + 8);
    auVar4._8_8_ = uStack_310;
    auVar4._0_8_ = local_318;
    local_68 = maxps((undefined1  [16])local_98->field_0,auVar4);
    local_50 = &local_1f8;
    local_1f8 = local_68._0_8_;
    uStack_1f0 = local_68._8_8_;
    local_1c0 = &(this_00->bounds1).upper;
    local_1c8 = &local_1f8;
    *(undefined8 *)&local_1c0->field_0 = local_68._0_8_;
    *(undefined8 *)((long)&(this_00->bounds1).upper.field_0 + 8) = local_68._8_8_;
    local_1b0 = local_1d0;
    local_180 = local_208;
    local_150 = local_208;
    local_120 = local_1d8;
    local_118 = local_1d0;
    __gnu_cxx::
    __normal_iterator<const_embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
    ::operator++(&local_2f8);
  }
  return __lhs;
}

Assistant:

virtual LBBox3fa lbounds() const
      {
        LBBox3fa b = empty;
        for (auto& c : children) b.extend(c->lbounds());
        return b;
      }